

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint HuffmanTree_makeFromLengths2(HuffmanTree *tree)

{
  uint uVar1;
  uint *puVar2;
  uint local_54;
  uint local_50;
  uint error;
  uint n;
  uint bits;
  uivector nextcode;
  uivector blcount;
  HuffmanTree *tree_local;
  
  local_54 = 0;
  uivector_init((uivector *)&nextcode.allocsize);
  uivector_init((uivector *)&n);
  puVar2 = (uint *)lodepng_malloc((ulong)tree->numcodes << 2);
  tree->tree1d = puVar2;
  if (tree->tree1d == (uint *)0x0) {
    local_54 = 0x53;
  }
  uVar1 = uivector_resizev((uivector *)&nextcode.allocsize,(ulong)(tree->maxbitlen + 1),0);
  if ((uVar1 == 0) ||
     (uVar1 = uivector_resizev((uivector *)&n,(ulong)(tree->maxbitlen + 1),0), uVar1 == 0)) {
    local_54 = 0x53;
  }
  if (local_54 == 0) {
    for (error = 0; error < tree->numcodes; error = error + 1) {
      *(int *)(nextcode.allocsize + (ulong)tree->lengths[error] * 4) =
           *(int *)(nextcode.allocsize + (ulong)tree->lengths[error] * 4) + 1;
    }
    for (error = 1; error <= tree->maxbitlen; error = error + 1) {
      _n[error] = (_n[error - 1] + *(int *)(nextcode.allocsize + (ulong)(error - 1) * 4)) * 2;
    }
    for (local_50 = 0; local_50 < tree->numcodes; local_50 = local_50 + 1) {
      if (tree->lengths[local_50] != 0) {
        uVar1 = _n[tree->lengths[local_50]];
        _n[tree->lengths[local_50]] = uVar1 + 1;
        tree->tree1d[local_50] = uVar1;
      }
    }
  }
  uivector_cleanup(&nextcode.allocsize);
  uivector_cleanup(&n);
  if (local_54 == 0) {
    tree_local._4_4_ = HuffmanTree_make2DTree(tree);
  }
  else {
    tree_local._4_4_ = local_54;
  }
  return tree_local._4_4_;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths2(HuffmanTree* tree)
{
  uivector blcount;
  uivector nextcode;
  unsigned bits, n, error = 0;

  uivector_init(&blcount);
  uivector_init(&nextcode);

  tree->tree1d = (unsigned*)lodepng_malloc(tree->numcodes * sizeof(unsigned));
  if(!tree->tree1d) error = 83; /*alloc fail*/

  if(!uivector_resizev(&blcount, tree->maxbitlen + 1, 0)
  || !uivector_resizev(&nextcode, tree->maxbitlen + 1, 0))
    error = 83; /*alloc fail*/

  if(!error)
  {
    /*step 1: count number of instances of each code length*/
    for(bits = 0; bits < tree->numcodes; bits++) blcount.data[tree->lengths[bits]]++;
    /*step 2: generate the nextcode values*/
    for(bits = 1; bits <= tree->maxbitlen; bits++)
    {
      nextcode.data[bits] = (nextcode.data[bits - 1] + blcount.data[bits - 1]) << 1;
    }
    /*step 3: generate all the codes*/
    for(n = 0; n < tree->numcodes; n++)
    {
      if(tree->lengths[n] != 0) tree->tree1d[n] = nextcode.data[tree->lengths[n]]++;
    }
  }

  uivector_cleanup(&blcount);
  uivector_cleanup(&nextcode);

  if(!error) return HuffmanTree_make2DTree(tree);
  else return error;
}